

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlparser.cpp
# Opt level: O2

void __thiscall
UrlParserTest::http_url_with_username_and_port::test_method(http_url_with_username_and_port *this)

{
  undefined1 local_338 [8];
  UrlParser parser;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  string local_78;
  uint16_t local_52;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "http://username:passwd@www.example.com:8080/dir/subdir?param=1&param=2;param%20=%20#fragment"
             ,(allocator<char> *)&local_78);
  httpparser::UrlParser::UrlParser((UrlParser *)local_338,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  parser.url._256_8_ = anon_var_dwarf_9ec8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&parser.url.integerPort,0x57);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_200 = "";
  local_78._M_dataplus._M_p._0_4_ = CONCAT31(local_78._M_dataplus._M_p._1_3_,local_338[0]);
  local_52 = CONCAT11(local_52._1_1_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_50,&local_208,0x57,1,2,&local_78,"parser.isValid()",&local_52,"true");
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_1f0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x58);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_f0 = "";
  httpparser::UrlParser::scheme_abi_cxx11_(&local_78,(UrlParser *)local_338);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (&local_50,&local_f8,0x58,1,2,&local_78,"parser.scheme()","http","\"http\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_1d0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x59);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_e0 = "";
  httpparser::UrlParser::username_abi_cxx11_(&local_78,(UrlParser *)local_338);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
            (&local_50,&local_e8,0x59,1,2,&local_78,"parser.username()","username","\"username\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_1b0 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x5a);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_d0 = "";
  httpparser::UrlParser::password_abi_cxx11_(&local_78,(UrlParser *)local_338);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (&local_50,&local_d8,0x5a,1,2,&local_78,"parser.password()","passwd","\"passwd\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_190 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x5b);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_c0 = "";
  httpparser::UrlParser::hostname_abi_cxx11_(&local_78,(UrlParser *)local_338);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[16]>
            (&local_50,&local_c8,0x5b,1,2,&local_78,"parser.hostname()","www.example.com",
             "\"www.example.com\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_170 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x5c);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_b0 = "";
  httpparser::UrlParser::path_abi_cxx11_(&local_78,(UrlParser *)local_338);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
            (&local_50,&local_b8,0x5c,1,2,&local_78,"parser.path()","/dir/subdir","\"/dir/subdir\"")
  ;
  std::__cxx11::string::~string((string *)&local_78);
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_150 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0x5d);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_a0 = "";
  httpparser::UrlParser::query_abi_cxx11_(&local_78,(UrlParser *)local_338);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[29]>
            (&local_50,&local_a8,0x5d,1,2,&local_78,"parser.query()","param=1&param=2;param%20=%20",
             "\"param=1&param=2;param%20=%20\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_130 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x5e);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_90 = "";
  httpparser::UrlParser::fragment_abi_cxx11_(&local_78,(UrlParser *)local_338);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
            (&local_50,&local_98,0x5e,1,2,&local_78,"parser.fragment()","fragment","\"fragment\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_110 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x5f);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_80 = "";
  local_52 = httpparser::UrlParser::httpPort((UrlParser *)local_338);
  local_78._M_dataplus._M_p._0_4_ = 0x1f90;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,int>
            (&local_50,&local_88,0x5f,1,2,&local_52,"parser.httpPort()",&local_78,"8080");
  httpparser::UrlParser::Url::~Url((Url *)&parser);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(http_url_with_username_and_port)
{
    const char *text = "http://username:passwd@www.example.com:8080/dir/subdir?param=1&param=2;param%20=%20#fragment";
    UrlParser parser(text);

    BOOST_CHECK_EQUAL(parser.isValid(), true);
    BOOST_CHECK_EQUAL(parser.scheme(), "http");
    BOOST_CHECK_EQUAL(parser.username(), "username");
    BOOST_CHECK_EQUAL(parser.password(), "passwd");
    BOOST_CHECK_EQUAL(parser.hostname(), "www.example.com");
    BOOST_CHECK_EQUAL(parser.path(), "/dir/subdir");
    BOOST_CHECK_EQUAL(parser.query(), "param=1&param=2;param%20=%20");
    BOOST_CHECK_EQUAL(parser.fragment(), "fragment");
    BOOST_CHECK_EQUAL(parser.httpPort(), 8080);
}